

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::set_say_func(CVmRun *this,vm_val_t *val)

{
  undefined8 *puVar1;
  vm_globalvar_t *pvVar2;
  undefined8 *in_RSI;
  long in_RDI;
  CVmObjTable *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    pvVar2 = CVmObjTable::create_global_var(unaff_retaddr);
    *(vm_globalvar_t **)(in_RDI + 0x28) = pvVar2;
  }
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  *puVar1 = *in_RSI;
  puVar1[1] = in_RSI[1];
  return;
}

Assistant:

void CVmRun::set_say_func(VMG_ const vm_val_t *val)
{
    /* 
     *   if we haven't yet allocated a global to hold the 'say' function,
     *   allocate one now 
     */
    if (say_func_ == 0)
        say_func_ = G_obj_table->create_global_var();

    /* remember the new function */
    say_func_->val = *val;
}